

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O1

SetupSendResult * __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::RpcRequest::setupSend
          (SetupSendResult *__return_storage_ptr__,RpcRequest *this,bool isTailCall)

{
  uint *puVar1;
  RpcConnectionState *pRVar2;
  Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *pMVar3;
  RemoveConst<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *pRVar4;
  OutgoingRpcMessage *pOVar5;
  uint *puVar6;
  size_t sVar7;
  ArrayDisposer *pAVar8;
  Builder payload;
  SourceLocation location;
  CapTableReader *pCVar9;
  CapTableReader *pCVar10;
  SegmentReader *pSVar11;
  SegmentBuilder *pSVar12;
  CapTableBuilder *pCVar13;
  WirePointer *pWVar14;
  PromiseArenaMember *node;
  int *piVar15;
  Disposer *node_00;
  undefined4 uVar16;
  long *plVar17;
  undefined4 uVar18;
  long lVar19;
  QuestionRef *pQVar20;
  Refcounted *refcounted;
  Question *pQVar21;
  QuestionRef *pQVar22;
  ArrayPtr<kj::Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> capTable;
  SendInternalResult result;
  Vector<int> fds;
  PromiseFulfillerPair<kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>_>
  paf;
  QuestionId questionId;
  Array<unsigned_int> exports;
  Array<int> result_1;
  PointerBuilder local_128;
  PromiseArenaMember *local_110;
  int *local_108;
  RemoveConst<int> *pRVar23;
  RemoveConst<int> *pRVar24;
  int *piVar25;
  ArrayDisposer *pAVar26;
  Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t> local_e8;
  undefined8 uStack_d8;
  QuestionId local_cc;
  QuestionRef *local_c8;
  QuestionRef *local_c0;
  Array<unsigned_int> local_b8;
  int *local_98;
  long lStack_90;
  ArrayDisposer *local_88;
  char *local_78;
  char *pcStack_70;
  undefined8 local_68;
  Maybe<kj::HashMap<capnp::ClientHook_*,_kj::Own<capnp::ClientHook,_std::nullptr_t>_>_&> local_60;
  StructBuilder local_58;
  
  local_108 = (int *)0x0;
  pRVar23 = (RemoveConst<int> *)0x0;
  pRVar24 = (RemoveConst<int> *)0x0;
  pAVar26 = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
  pRVar2 = (this->connectionState).ptr;
  pMVar3 = (this->capTable).table.builder.ptr;
  pRVar4 = (this->capTable).table.builder.pos;
  local_128.segment = (this->callBuilder)._builder.segment;
  local_128.capTable = (this->callBuilder)._builder.capTable;
  local_128.pointer = (this->callBuilder)._builder.pointers + 1;
  PointerBuilder::getStruct(&local_58,&local_128,(StructSize)0x20000,(word *)0x0);
  local_60.ptr = (HashMap<capnp::ClientHook_*,_kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)0x0;
  payload._builder.capTable = local_58.capTable;
  payload._builder.segment = local_58.segment;
  payload._builder.data = local_58.data;
  payload._builder.pointers = local_58.pointers;
  payload._builder.dataSize = local_58.dataSize;
  payload._builder.pointerCount = local_58.pointerCount;
  payload._builder._38_2_ = local_58._38_2_;
  capTable.size_ = (long)pRVar4 - (long)pMVar3 >> 4;
  capTable.ptr = pMVar3;
  writeDescriptors(&local_b8,pRVar2,capTable,payload,(Vector<int> *)&local_108,&local_60);
  pOVar5 = (this->message).ptr;
  if (pRVar23 != pRVar24) {
    kj::Vector<int>::setCapacity((Vector<int> *)&local_108,(long)pRVar23 - (long)local_108 >> 2);
  }
  lStack_90 = (long)pRVar23 - (long)local_108 >> 2;
  local_98 = local_108;
  local_108 = (int *)0x0;
  pRVar23 = (RemoveConst<int> *)0x0;
  piVar25 = (int *)0x0;
  local_88 = pAVar26;
  (*pOVar5->_vptr_OutgoingRpcMessage[1])(pOVar5);
  lVar19 = lStack_90;
  piVar15 = local_98;
  if (local_98 != (int *)0x0) {
    local_98 = (int *)0x0;
    lStack_90 = 0;
    (**local_88->_vptr_ArrayDisposer)(local_88,piVar15,4,lVar19,lVar19,0);
  }
  pQVar21 = anon_unknown_18::
            ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::next
                      (&((this->connectionState).ptr)->questions,&local_cc);
  pQVar21->isAwaitingReturn = true;
  puVar6 = (pQVar21->paramExports).ptr;
  if (puVar6 != (uint *)0x0) {
    sVar7 = (pQVar21->paramExports).size_;
    pAVar8 = (pQVar21->paramExports).disposer;
    (pQVar21->paramExports).ptr = (uint *)0x0;
    (pQVar21->paramExports).size_ = 0;
    (**pAVar8->_vptr_ArrayDisposer)(pAVar8,puVar6,4,sVar7,sVar7,0);
  }
  (pQVar21->paramExports).ptr = local_b8.ptr;
  (pQVar21->paramExports).size_ = local_b8.size_;
  (pQVar21->paramExports).disposer = local_b8.disposer;
  local_b8.ptr = (uint *)0x0;
  local_b8.size_ = 0;
  pQVar21->isTailCall = isTailCall;
  local_128.segment = (SegmentBuilder *)0x0;
  local_128.capTable = (CapTableBuilder *)0x0;
  local_128.pointer = (WirePointer *)0x0;
  local_78 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++";
  pcStack_70 = "setupSend";
  local_68 = 0x1200000a10;
  location.function = (char *)piVar25;
  location.fileName = (char *)pRVar23;
  location._16_8_ = pAVar26;
  kj::
  newPromiseAndFulfiller<kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,decltype(nullptr)>>>
            (location);
  pRVar2 = (this->connectionState).ptr;
  pQVar22 = (QuestionRef *)operator_new(0x38);
  pSVar12 = local_128.segment;
  uVar16 = (undefined4)uStack_d8;
  uVar18 = uStack_d8._4_4_;
  uStack_d8 = (long *)0x0;
  (pQVar22->super_Refcounted).refcount = 0;
  (pQVar22->super_Refcounted).super_Disposer._vptr_Disposer =
       (_func_int **)&PTR_disposeImpl_006f9b48;
  puVar1 = &(pRVar2->super_Refcounted).refcount;
  *puVar1 = *puVar1 + 1;
  (pQVar22->connectionState).ptr.disposer = &(pRVar2->super_Refcounted).super_Disposer;
  (pQVar22->connectionState).ptr.ptr = pRVar2;
  pQVar22->id = local_cc;
  *(undefined4 *)&(pQVar22->fulfiller).ptr.disposer = local_e8.ptr._0_4_;
  *(undefined4 *)((long)&(pQVar22->fulfiller).ptr.disposer + 4) = local_e8.ptr._4_4_;
  *(undefined4 *)&(pQVar22->fulfiller).ptr.ptr = uVar16;
  *(undefined4 *)((long)&(pQVar22->fulfiller).ptr.ptr + 4) = uVar18;
  (pQVar22->super_Refcounted).refcount = 1;
  pQVar20 = pQVar22;
  if (local_128.capTable != (CapTableBuilder *)0x0) {
    pCVar9 = &(local_128.capTable)->super_CapTableReader;
    pCVar10 = &(local_128.capTable)->super_CapTableReader;
    pSVar11 = &(local_128.segment)->super_SegmentReader;
    local_128.segment = (SegmentBuilder *)pQVar22;
    local_128.capTable = (CapTableBuilder *)pQVar22;
    (*(code *)pSVar11->arena->_vptr_Arena)
              (pSVar12,pCVar9->_vptr_CapTableReader[-2] + (long)&pCVar10->_vptr_CapTableReader);
    pQVar22 = (QuestionRef *)local_128.segment;
    pQVar20 = (QuestionRef *)local_128.capTable;
  }
  local_128.capTable = (CapTableBuilder *)pQVar20;
  local_128.segment = (SegmentBuilder *)pQVar22;
  (pQVar21->selfRef).ptr = (QuestionRef *)local_128.capTable;
  puVar1 = &((Refcounted *)&(local_128.capTable)->super_CapTableReader)->refcount;
  *puVar1 = *puVar1 + 1;
  local_c8 = (QuestionRef *)local_128.capTable;
  local_c0 = (QuestionRef *)local_128.capTable;
  kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,decltype(nullptr)>>::
  attach<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,decltype(nullptr)>>
            ((Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,decltype(nullptr)>>
              *)&local_110,&local_e8);
  pWVar14 = local_128.pointer;
  local_128.pointer = (WirePointer *)local_110;
  local_110 = (PromiseArenaMember *)0x0;
  if ((PromiseArenaMember *)pWVar14 != (PromiseArenaMember *)0x0) {
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pWVar14);
  }
  node = local_110;
  if (local_110 != (PromiseArenaMember *)0x0) {
    local_110 = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose(node);
  }
  pQVar22 = local_c0;
  if (local_c0 != (QuestionRef *)0x0) {
    local_c0 = (QuestionRef *)0x0;
    (**(local_c8->super_Refcounted).super_Disposer._vptr_Disposer)
              (local_c8,(pQVar22->super_Refcounted).super_Disposer._vptr_Disposer[-2] +
                        (long)&(pQVar22->super_Refcounted).super_Disposer._vptr_Disposer);
  }
  plVar17 = uStack_d8;
  (__return_storage_ptr__->super_SendInternalResult).questionRef.disposer =
       (Disposer *)local_128.segment;
  (__return_storage_ptr__->super_SendInternalResult).questionRef.ptr =
       (QuestionRef *)local_128.capTable;
  local_128.capTable = (CapTableBuilder *)0x0;
  (__return_storage_ptr__->super_SendInternalResult).promise.super_PromiseBase.node.ptr =
       (PromiseNode *)local_128.pointer;
  local_128.pointer = (WirePointer *)0x0;
  __return_storage_ptr__->questionId = local_cc;
  __return_storage_ptr__->question = pQVar21;
  if (uStack_d8 != (long *)0x0) {
    uStack_d8 = (long *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_e8.ptr._4_4_,local_e8.ptr._0_4_))
              ((undefined8 *)CONCAT44(local_e8.ptr._4_4_,local_e8.ptr._0_4_),
               (long)plVar17 + *(long *)(*plVar17 + -0x10));
  }
  node_00 = local_e8.disposer;
  if ((PromiseArenaMember *)local_e8.disposer != (PromiseArenaMember *)0x0) {
    local_e8.disposer = (Disposer *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node_00);
  }
  pWVar14 = local_128.pointer;
  if ((PromiseArenaMember *)local_128.pointer != (PromiseArenaMember *)0x0) {
    local_128.pointer = (WirePointer *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pWVar14);
  }
  pCVar13 = local_128.capTable;
  if (local_128.capTable != (CapTableBuilder *)0x0) {
    local_128.capTable = (CapTableBuilder *)0x0;
    (**(((Refcounted *)&(local_128.segment)->super_SegmentReader)->super_Disposer)._vptr_Disposer)
              (local_128.segment,
               (pCVar13->super_CapTableReader)._vptr_CapTableReader[-2] +
               (long)&(pCVar13->super_CapTableReader)._vptr_CapTableReader);
  }
  sVar7 = local_b8.size_;
  puVar6 = local_b8.ptr;
  if (local_b8.ptr != (uint *)0x0) {
    local_b8.ptr = (uint *)0x0;
    local_b8.size_ = 0;
    (**(local_b8.disposer)->_vptr_ArrayDisposer)(local_b8.disposer,puVar6,4,sVar7,sVar7,0);
  }
  piVar15 = local_108;
  if (local_108 != (int *)0x0) {
    local_108 = (int *)0x0;
    (**pAVar26->_vptr_ArrayDisposer)
              (pAVar26,piVar15,4,(long)pRVar23 - (long)piVar15 >> 2,
               (long)piVar25 - (long)piVar15 >> 2,0);
  }
  return __return_storage_ptr__;
}

Assistant:

SetupSendResult setupSend(bool isTailCall) {
      // Build the cap table.
      kj::Vector<int> fds;
      auto exports = connectionState->writeDescriptors(
          capTable.getTable(), callBuilder.getParams(), fds);
      message->setFds(fds.releaseAsArray());

      // Init the question table.  Do this after writing descriptors to avoid interference.
      QuestionId questionId;
      auto& question = connectionState->questions.next(questionId);
      question.isAwaitingReturn = true;
      question.paramExports = kj::mv(exports);
      question.isTailCall = isTailCall;

      // Make the QuestionRef and result promise.
      SendInternalResult result;
      auto paf = kj::newPromiseAndFulfiller<kj::Promise<kj::Own<RpcResponse>>>();
      result.questionRef = kj::refcounted<QuestionRef>(
          *connectionState, questionId, kj::mv(paf.fulfiller));
      question.selfRef = *result.questionRef;
      result.promise = paf.promise.attach(kj::addRef(*result.questionRef));

      return { kj::mv(result), questionId, question };
    }